

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_get_timestamp(AMQP_VALUE value,int64_t *timestamp_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || timestamp_value == (int64_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x37f;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_timestamp",0x37e,1,"Bad arguments: value = %p, timestamp_value = %p"
                ,value,timestamp_value);
    }
  }
  else if (value->type == AMQP_TYPE_TIMESTAMP) {
    *timestamp_value = (int64_t)(value->value).described_value.descriptor;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x388;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_timestamp",0x387,1,"Value is not of type TIMESTAMP");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_timestamp(AMQP_VALUE value, int64_t* timestamp_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_111: [If any of the arguments is NULL then amqpvalue_get_timestamp shall return a non-zero value.] */
    if ((value == NULL) ||
        (timestamp_value == NULL))
    {
        LogError("Bad arguments: value = %p, timestamp_value = %p",
            value, timestamp_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_112: [If the type of the value is not timestamp (was not created with amqpvalue_create_timestamp), then amqpvalue_get_timestamp shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_TIMESTAMP)
        {
            LogError("Value is not of type TIMESTAMP");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_109: [amqpvalue_get_timestamp shall fill in the timestamp_value argument the timestamp value stored by the AMQP value indicated by the value argument.] */
            *timestamp_value = value_data->value.timestamp_value;

            /* Codes_SRS_AMQPVALUE_01_110: [On success amqpvalue_get_timestamp shall return 0.] */
            result = 0;
        }
    }

    return result;
}